

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TextureIterator __thiscall QRhiPassResourceTracker::cbeginTextures(QRhiPassResourceTracker *this)

{
  ulong uVar1;
  Data *pDVar2;
  ulong uVar3;
  TextureIterator TVar4;
  TextureIterator TVar5;
  
  pDVar2 = (this->m_textures).d;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else if (pDVar2->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (pDVar2->numBuckets == uVar3) {
        return (piter)ZEXT816(0);
      }
      uVar1 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    TVar4.i.bucket = uVar3;
    TVar4.i.d = pDVar2;
    return (TextureIterator)TVar4.i;
  }
  TVar5.i.bucket = 0;
  TVar5.i.d = pDVar2;
  return (TextureIterator)TVar5.i;
}

Assistant:

inline const_iterator cbegin() const noexcept { return d ? const_iterator(d->begin()): const_iterator(); }